

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::internal::
specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>_>
::check_sign(specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>_>
             *this)

{
  type tVar1;
  
  require_numeric_argument(this);
  tVar1 = this->arg_type_;
  if ((tVar1 - named_arg_type < 7) && ((char_type < tVar1 || ((0x94U >> (tVar1 & 0x1f) & 1) == 0))))
  {
    specs_handler<fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
    ::on_error(&this->
                super_specs_handler<fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
               ,"format specifier requires signed argument");
    return;
  }
  return;
}

Assistant:

FMT_CONSTEXPR void check_sign() {
    require_numeric_argument();
    if (is_integral(arg_type_) && arg_type_ != int_type &&
        arg_type_ != long_long_type && arg_type_ != internal::char_type) {
      this->on_error("format specifier requires signed argument");
    }
  }